

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewScObjArrayNoArg(Lowerer *this,Instr *newObjInstr)

{
  OpCode opcode;
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  ProfileId index;
  BailOutKind BVar3;
  BailOutKind BVar4;
  Opnd *this_00;
  Instr *pIVar5;
  undefined4 *puVar6;
  LabelInstr *pLVar7;
  Opnd *pOVar8;
  Opnd *src1Opnd;
  ProfiledInstr *pPVar9;
  JITTimeProfileInfo *pJVar10;
  AddrOpnd *pAVar11;
  HelperCallOpnd *newSrc;
  LabelInstr *labelDone;
  ArrayCallSiteInfo *pAStack_60;
  ProfileId profileId;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t arrayInfoAddr;
  intptr_t weakFuncRef;
  ProfiledInstr *instrNew;
  LabelInstr *labelSkipBailOut;
  Instr *startMarkerInstr;
  Func *func;
  Opnd *targetOpnd;
  Instr *newObjInstr_local;
  Lowerer *this_local;
  
  this_00 = IR::Instr::GetSrc1(newObjInstr);
  func_00 = newObjInstr->m_func;
  bVar2 = IR::Opnd::IsAddrOpnd(this_00);
  if (bVar2) {
    labelSkipBailOut = (LabelInstr *)InsertLoweredRegionStartMarker(this,newObjInstr);
    targetOpnd = (Opnd *)newObjInstr;
  }
  else {
    bVar2 = IR::Instr::HasBailOutInfo(newObjInstr);
    if ((!bVar2) || (bVar2 = IR::Instr::OnlyHasLazyBailOut(newObjInstr), bVar2)) {
      pIVar5 = LowerNewScObject(this,newObjInstr,true,false,false);
      return pIVar5;
    }
    labelSkipBailOut = (LabelInstr *)InsertLoweredRegionStartMarker(this,newObjInstr);
    BVar3 = IR::Instr::GetBailOutKind(newObjInstr);
    if (BVar3 != BailOutOnNotNativeArray) {
      BVar3 = IR::Instr::GetBailOutKind(newObjInstr);
      BVar4 = BailOutInfo::WithLazyBailOut(BailOutOnNotNativeArray);
      if (BVar3 != BVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1511,
                           "(newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray))"
                           ,
                           "newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray || newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    pLVar7 = IR::LabelInstr::New(Label,func_00,false);
    pOVar8 = LoadLibraryValueOpnd(this,newObjInstr,ValueArrayConstructor);
    InsertCompareBranch(this,this_00,pOVar8,BrEq_A,true,pLVar7,newObjInstr,false);
    opcode = newObjInstr->m_opcode;
    pOVar8 = IR::Instr::UnlinkDst(newObjInstr);
    src1Opnd = IR::Instr::UnlinkSrc1(newObjInstr);
    targetOpnd = (Opnd *)IR::ProfiledInstr::New(opcode,pOVar8,src1Opnd,func_00);
    pPVar9 = IR::Instr::AsProfiledInstr(newObjInstr);
    (((ProfiledInstr *)targetOpnd)->u).profileId = (pPVar9->u).profileId;
    IR::Instr::InsertAfter(newObjInstr,(Instr *)targetOpnd);
    newObjInstr->m_opcode = BailOut;
    GenerateBailOut(this,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    IR::Instr::InsertBefore((Instr *)targetOpnd,&pLVar7->super_Instr);
  }
  bVar2 = IR::Instr::IsProfiledInstr((Instr *)targetOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x152c,"(newObjInstr->IsProfiledInstr())","newObjInstr->IsProfiledInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  arrayInfoAddr = 0;
  arrayInfo = (ArrayCallSiteInfo *)0x0;
  pAStack_60 = (ArrayCallSiteInfo *)0x0;
  pPVar9 = IR::Instr::AsProfiledInstr((Instr *)targetOpnd);
  index = (pPVar9->u).field_3.fldInfoData.f1;
  if (index != 0xffff) {
    pJVar10 = Func::GetReadOnlyProfileInfo(func_00);
    pAStack_60 = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar10,index);
    pJVar10 = Func::GetReadOnlyProfileInfo(func_00);
    arrayInfo = (ArrayCallSiteInfo *)JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar10,index);
    if (pAStack_60 == (ArrayCallSiteInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1536,"(arrayInfo)","arrayInfo");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    arrayInfoAddr = Func::GetWeakFuncRef(func_00);
    if (arrayInfoAddr == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1538,"(weakFuncRef)","weakFuncRef");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  pLVar7 = IR::LabelInstr::New(Label,func_00,false);
  GenerateProfiledNewScObjArrayFastPath
            (this,(Instr *)targetOpnd,pAStack_60,(intptr_t)arrayInfo,arrayInfoAddr,0,pLVar7,true);
  IR::Instr::InsertAfter((Instr *)targetOpnd,&pLVar7->super_Instr);
  pAVar11 = IR::AddrOpnd::New(arrayInfoAddr,AddrOpndKindDynamicFunctionBodyWeakRef,func_00,false,
                              (Var)0x0);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)targetOpnd,&pAVar11->super_Opnd);
  pAVar11 = IR::AddrOpnd::New((intptr_t)arrayInfo,AddrOpndKindDynamicArrayCallSiteInfo,func_00,false
                              ,(Var)0x0);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)targetOpnd,&pAVar11->super_Opnd);
  LoadScriptContext(this,(Instr *)targetOpnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,(Instr *)targetOpnd,this_00);
  IR::Instr::UnlinkSrc1((Instr *)targetOpnd);
  newSrc = IR::HelperCallOpnd::New(HelperScrArr_ProfiledNewInstanceNoArg,func_00);
  IR::Instr::SetSrc1((Instr *)targetOpnd,&newSrc->super_Opnd);
  LowererMD::LowerCall(&this->m_lowererMD,(Instr *)targetOpnd,0);
  pIVar5 = RemoveLoweredRegionStartMarker(this,&labelSkipBailOut->super_Instr);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObjArrayNoArg(IR::Instr *newObjInstr)
{
    IR::Opnd *targetOpnd = newObjInstr->GetSrc1();
    Func *func = newObjInstr->m_func;

    IR::Instr* startMarkerInstr = nullptr;

    if (!targetOpnd->IsAddrOpnd())
    {
        if (!newObjInstr->HasBailOutInfo() || newObjInstr->OnlyHasLazyBailOut())
        {
            return this->LowerNewScObject(newObjInstr, true, false);
        }

        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

        // For whatever reason, we couldn't do a fixed function check on the call target.
        // Generate a runtime check on the target.
        Assert(
            newObjInstr->GetBailOutKind() == IR::BailOutOnNotNativeArray ||
            newObjInstr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(IR::BailOutOnNotNativeArray)
        );
        IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, func);
        InsertCompareBranch(
            targetOpnd,
            LoadLibraryValueOpnd(newObjInstr, LibraryValue::ValueArrayConstructor),
            Js::OpCode::BrEq_A,
            true,
            labelSkipBailOut,
            newObjInstr);

        IR::ProfiledInstr *instrNew = IR::ProfiledInstr::New(newObjInstr->m_opcode, newObjInstr->UnlinkDst(), newObjInstr->UnlinkSrc1(), func);
        instrNew->u.profileId = newObjInstr->AsProfiledInstr()->u.profileId;
        newObjInstr->InsertAfter(instrNew);
        newObjInstr->m_opcode = Js::OpCode::BailOut;
        GenerateBailOut(newObjInstr);

        instrNew->InsertBefore(labelSkipBailOut);
        newObjInstr = instrNew;
    }
    else
    {
        // Insert a temporary label before the instruction we're about to lower, so that we can return
        // the first instruction above that needs to be lowered after we're done - regardless of argument
        // list, StartCall, etc.
        startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);
    }

    Assert(newObjInstr->IsProfiledInstr());

    intptr_t weakFuncRef = 0;
    intptr_t arrayInfoAddr = 0;
    Js::ArrayCallSiteInfo *arrayInfo = nullptr;
    Js::ProfileId profileId = static_cast<Js::ProfileId>(newObjInstr->AsProfiledInstr()->u.profileId);
    if (profileId != Js::Constants::NoProfileId)
    {
        arrayInfo = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
        arrayInfoAddr = func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);
        Assert(arrayInfo);
        weakFuncRef = func->GetWeakFuncRef();
        Assert(weakFuncRef);
    }

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    GenerateProfiledNewScObjArrayFastPath(newObjInstr, arrayInfo, arrayInfoAddr, weakFuncRef, 0, labelDone, true);
    newObjInstr->InsertAfter(labelDone);

    m_lowererMD.LoadHelperArgument(newObjInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, func));
    m_lowererMD.LoadHelperArgument(newObjInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, func));

    LoadScriptContext(newObjInstr);

    m_lowererMD.LoadHelperArgument(newObjInstr, targetOpnd);
    newObjInstr->UnlinkSrc1();
    newObjInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperScrArr_ProfiledNewInstanceNoArg, func));
    m_lowererMD.LowerCall(newObjInstr, 0);

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}